

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce.h
# Opt level: O2

void __thiscall
AllReduceSockets::pass_up<unsigned_long>
          (AllReduceSockets *this,char *buffer,size_t left_read_pos,size_t right_read_pos,
          size_t *parent_sent_pos)

{
  ulong uVar1;
  ssize_t sVar2;
  ostream *poVar3;
  vw_exception *this_00;
  uint uVar4;
  size_t __n;
  string sStack_1d8;
  stringstream __msg;
  ostream local_1a8;
  
  if (right_read_pos < left_read_pos) {
    left_read_pos = right_read_pos;
  }
  uVar1 = *parent_sent_pos;
  __n = (left_read_pos & 0xfffffffffffffff8) - uVar1;
  if (0xffff < __n) {
    __n = 0x10000;
  }
  if ((left_read_pos & 0xfffffffffffffff8) != uVar1) {
    sVar2 = send((this->socks).parent,buffer + uVar1,__n,0);
    uVar4 = (uint)sVar2;
    if ((int)uVar4 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
      poVar3 = std::operator<<(&local_1a8,"Write to parent failed ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/allreduce.h"
                 ,0xc2,&sStack_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    *parent_sent_pos = *parent_sent_pos + (ulong)(uVar4 & 0x7fffffff);
  }
  return;
}

Assistant:

void pass_up(char* buffer, size_t left_read_pos, size_t right_read_pos, size_t& parent_sent_pos)
  {
    size_t my_bufsize =
        (std::min)(ar_buf_size, (std::min)(left_read_pos, right_read_pos) / sizeof(T) * sizeof(T) - parent_sent_pos);

    if (my_bufsize > 0)
    {  // going to pass up this chunk of data to the parent
      int write_size = send(socks.parent, buffer + parent_sent_pos, (int)my_bufsize, 0);
      if (write_size < 0)
        THROW("Write to parent failed " << my_bufsize << " " << write_size << " " << parent_sent_pos << " "
                                        << left_read_pos << " " << right_read_pos);

      parent_sent_pos += write_size;
    }
  }